

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::stmt_set_left(AssignStmt *stmt,Var *target,Var *new_var)

{
  Var *this;
  VarType VVar1;
  InternalException *this_00;
  allocator<char> local_69;
  string local_68;
  enable_shared_from_this<kratos::Var> local_38;
  Var **local_28;
  Var **left;
  Var *new_var_local;
  Var *target_local;
  AssignStmt *stmt_local;
  
  left = (Var **)new_var;
  new_var_local = target;
  target_local = (Var *)stmt;
  local_28 = AssignStmt::left(stmt);
  VVar1 = Var::type(*local_28);
  if (((VVar1 != Base) && (VVar1 = Var::type(*local_28), VVar1 != PortIO)) &&
     (VVar1 = Var::type(*local_28), VVar1 != ConstValue)) {
    change_var_parent(local_28,new_var_local,(Var *)left);
    return;
  }
  this = target_local;
  if (*local_28 == new_var_local) {
    std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_38);
    AssignStmt::set_left((AssignStmt *)this,(shared_ptr<kratos::Var> *)&local_38);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_38);
    (*((*local_28)->super_IRNode)._vptr_IRNode[0x14])(*local_28,left);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Target not found",&local_69);
  InternalException::InternalException(this_00,&local_68);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void stmt_set_left(AssignStmt *stmt, Var *target, Var *new_var) {
    auto &left = stmt->left();
    if (left->type() == VarType::Base || left->type() == VarType::PortIO ||
        left->type() == VarType::ConstValue) {
        if (left == target) {
            stmt->set_left(new_var->shared_from_this());
            left->move_linked_to(new_var);
        } else {
            throw InternalException("Target not found");
        }
    } else {
        change_var_parent(left, target, new_var);
    }
}